

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.cpp
# Opt level: O3

void Js::PropertyValueInfo::SetCacheInfo
               (PropertyValueInfo *info,PolymorphicInlineCache *polymorphicInlineCache,
               bool allowResizing)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (info == (PropertyValueInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/RecyclableObject.cpp"
                                ,0x32,"(info)","info");
    if (!bVar2) goto LAB_00dcd968;
    *puVar3 = 0;
  }
  if (polymorphicInlineCache == (PolymorphicInlineCache *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/RecyclableObject.cpp"
                                ,0x33,"(polymorphicInlineCache)","polymorphicInlineCache");
    if (!bVar2) {
LAB_00dcd968:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  info->functionBody = (FunctionBody *)0x0;
  info->inlineCache = (InlineCache *)0x0;
  info->polymorphicInlineCache = polymorphicInlineCache;
  info->inlineCacheIndex = 0xffffffff;
  info->allowResizingPolymorphicInlineCache = allowResizing;
  return;
}

Assistant:

void PropertyValueInfo::SetCacheInfo(_Out_ PropertyValueInfo* info, _In_ PolymorphicInlineCache *const polymorphicInlineCache, bool allowResizing)
    {
        Assert(info);
        Assert(polymorphicInlineCache);

        info->functionBody = nullptr;
        info->inlineCache = nullptr;
        info->polymorphicInlineCache = polymorphicInlineCache;
        info->inlineCacheIndex = Js::Constants::NoInlineCacheIndex;
        info->allowResizingPolymorphicInlineCache = allowResizing;
    }